

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamespaceScope.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::NamespaceScope::NamespaceScope(NamespaceScope *this,MemoryManager *manager)

{
  int iVar1;
  undefined4 extraout_var;
  
  (this->super_XercesNamespaceResolver)._vptr_XercesNamespaceResolver =
       (_func_int **)&PTR_getNamespaceForPrefix_0040ee78;
  this->fEmptyNamespaceId = 0;
  this->fStackCapacity = 8;
  this->fStackTop = 0;
  XMLStringPool::XMLStringPool(&this->fPrefixPool,0x6d,manager);
  this->fStack = (StackElem **)0x0;
  this->fMemoryManager = manager;
  iVar1 = (*manager->_vptr_MemoryManager[3])(manager);
  this->fStack = (StackElem **)CONCAT44(extraout_var,iVar1);
  memset((StackElem **)CONCAT44(extraout_var,iVar1),0,(ulong)this->fStackCapacity << 3);
  return;
}

Assistant:

NamespaceScope::NamespaceScope(MemoryManager* const manager /*= XMLPlatformUtils::fgMemoryManager*/) :
    fEmptyNamespaceId(0)
    , fStackCapacity(8)
    , fStackTop(0)
    , fPrefixPool(109, manager)
    , fStack(0)
    , fMemoryManager(manager)
{
    // Do an initial allocation of the stack and zero it out
    fStack = (StackElem**) fMemoryManager->allocate
    (
        fStackCapacity * sizeof(StackElem*)
    );//new StackElem*[fStackCapacity];
    memset(fStack, 0, fStackCapacity * sizeof(StackElem*));
}